

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseNamespacing(Parser *this,string *id,string *last)

{
  string *in_RCX;
  
  while (*(int *)((long)&id->field_2 + 0xc) == 0x2e) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114ddb;
    CheckedError::~CheckedError((CheckedError *)this);
    std::__cxx11::string::append((char *)last);
    std::__cxx11::string::append((string *)last);
    if (in_RCX != (string *)0x0) {
      std::__cxx11::string::_M_assign(in_RCX);
    }
    Expect(this,(int)id);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114ddb;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00114ddb:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNamespacing(std::string *id, std::string *last) {
  while (Is('.')) {
    NEXT();
    *id += ".";
    *id += attribute_;
    if (last) *last = attribute_;
    EXPECT(kTokenIdentifier);
  }
  return NoError();
}